

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Embedding.h
# Opt level: O2

void __thiscall
Embedding<float>::backward
          (Embedding<float> *this,SentenceView *sentView,Vector<float> *grad,float lr,int cbow)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (cbow == 0) {
    uVar1 = this->embeddingSize;
    iVar9 = (sentView->sent->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[sentView->central] * uVar1;
    pfVar5 = grad->base;
    uVar11 = 0;
    uVar10 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar10 = uVar11;
    }
    pfVar6 = this->matrix;
    for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      pfVar6[(long)iVar9 + uVar11] = pfVar5[uVar11] * -lr + pfVar6[(long)iVar9 + uVar11];
    }
  }
  else {
    iVar9 = sentView->right;
    uVar1 = sentView->left;
    lVar7 = (long)(int)uVar1;
    iVar2 = sentView->central;
    pvVar4 = sentView->sent;
    uVar3 = this->embeddingSize;
    uVar10 = 0;
    if (0 < (int)uVar3) {
      uVar10 = (ulong)uVar3;
    }
    for (; lVar7 < iVar9; lVar7 = lVar7 + 1) {
      if (lVar7 != iVar2) {
        iVar8 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar7] * uVar3;
        pfVar5 = grad->base;
        pfVar6 = this->matrix;
        for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
          pfVar6[(long)iVar8 + uVar11] =
               pfVar6[(long)iVar8 + uVar11] - (pfVar5[uVar11] * lr) / (float)(int)(~uVar1 + iVar9);
        }
      }
    }
  }
  return;
}

Assistant:

void Embedding<T>::backward(SentenceView &sentView, Vector<T> &grad, T lr, int cbow)
{
    int idx, base;
    if (cbow)
    {
        int C = sentView.right - sentView.left - 1;
        for (int j = sentView.left; j < sentView.right; j++)
        {
            if (j == sentView.central)
                continue;
            idx = sentView.sent[j];
            base = embeddingSize * idx;
            for (int i = 0; i < embeddingSize; i++)
                matrix[base + i] -= lr * grad.base[i] / C;
        }
    } else
    {
        idx = sentView.sent[sentView.central];
        base = embeddingSize * idx;
        for (int i = 0; i < embeddingSize; i++)
            matrix[base + i] -= lr * grad.base[i];
    }
}